

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatchkit.hpp
# Opt level: O0

pair<unsigned_long,_chaiscript::Boxed_Value> * __thiscall
chaiscript::detail::Dispatch_Engine::get_function_object_int
          (pair<unsigned_long,_chaiscript::Boxed_Value> *__return_storage_ptr__,
          Dispatch_Engine *this,string_view t_name,size_t t_hint)

{
  bool bVar1;
  pointer ppVar2;
  range_error *this_00;
  allocator<char> local_c9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>
  *local_78;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>
  *local_70;
  difference_type local_68;
  pair<long,_chaiscript::Boxed_Value> local_60;
  __normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>_>_>_>
  local_48;
  __normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>_>_>_>
  local_40;
  __normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>_>_>_>
  itr;
  QuickFlatMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value,_chaiscript::str_equal>
  *funs;
  size_t t_hint_local;
  Dispatch_Engine *this_local;
  string_view t_name_local;
  
  t_name_local._M_len = (size_t)t_name._M_str;
  this_local = (Dispatch_Engine *)t_name._M_len;
  t_name_local._M_str = (char *)__return_storage_ptr__;
  itr._M_current =
       (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>
        *)get_boxed_functions_int_abi_cxx11_(this);
  local_40 = utility::
             QuickFlatMap<std::__cxx11::string,chaiscript::Boxed_Value,chaiscript::str_equal>::
             find<std::basic_string_view<char,std::char_traits<char>>>
                       ((QuickFlatMap<std::__cxx11::string,chaiscript::Boxed_Value,chaiscript::str_equal>
                         *)itr._M_current,
                        (basic_string_view<char,_std::char_traits<char>_> *)&this_local,t_hint);
  local_48._M_current =
       (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>
        *)utility::
          QuickFlatMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value,_chaiscript::str_equal>
          ::end(itr._M_current);
  bVar1 = __gnu_cxx::
          operator==<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>_>_>_>
                    (&local_40,&local_48);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    this_00 = (range_error *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              ((string *)&local_c8,(basic_string_view<char,_std::char_traits<char>_> *)&this_local,
               &local_c9);
    std::operator+(&local_a8,"Object not found: ",&local_c8);
    std::range_error::range_error(this_00,(string *)&local_a8);
    __cxa_throw(this_00,&std::range_error::typeinfo,std::range_error::~range_error);
  }
  local_70 = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>
              *)utility::
                QuickFlatMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value,_chaiscript::str_equal>
                ::begin(itr._M_current);
  local_78 = local_40._M_current;
  local_68 = std::
             distance<__gnu_cxx::__normal_iterator<std::pair<std::__cxx11::string,chaiscript::Boxed_Value>const*,std::vector<std::pair<std::__cxx11::string,chaiscript::Boxed_Value>,std::allocator<std::pair<std::__cxx11::string,chaiscript::Boxed_Value>>>>>
                       ((__normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>_>_>_>
                         )local_70,local_40);
  ppVar2 = __gnu_cxx::
           __normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>_>_>_>
           ::operator->(&local_40);
  std::make_pair<long,chaiscript::Boxed_Value_const&>(&local_60,&local_68,&ppVar2->second);
  std::pair<unsigned_long,_chaiscript::Boxed_Value>::pair<long,_chaiscript::Boxed_Value,_true>
            (__return_storage_ptr__,&local_60);
  std::pair<long,_chaiscript::Boxed_Value>::~pair(&local_60);
  return __return_storage_ptr__;
}

Assistant:

std::pair<size_t, Boxed_Value> get_function_object_int(std::string_view t_name, const size_t t_hint) const {
        const auto &funs = get_boxed_functions_int();

        if (const auto itr = funs.find(t_name, t_hint); itr != funs.end()) {
          return std::make_pair(std::distance(funs.begin(), itr), itr->second);
        } else {
          throw std::range_error("Object not found: " + std::string(t_name));
        }
      }